

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O0

int trackerboy::ChannelControl<(trackerboy::ChType)1>::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ChannelState *in_RDX;
  WaveformTable *in_RSI;
  ChannelState local_28;
  ChannelState fakeLast;
  ChannelState *state_local;
  WaveformTable *waveTable_local;
  IApuIo *apu_local;
  
  local_28._1_7_ = SUB87(*in_RDX,1);
  local_28 = (ChannelState)((CONCAT71(local_28._1_7_,in_RDX->playing) ^ 0xff) & 0xffffffffffffff01);
  local_28 = (ChannelState)
             (CONCAT26(in_RDX->frequency,
                       (int6)CONCAT44(CONCAT31(local_28._5_3_,in_RDX->panning),
                                      CONCAT13(in_RDX->timbre,
                                               CONCAT12(in_RDX->envelope,local_28._0_2_)))) ^
             0xffff00ffffff0000);
  update((IApuIo *)ctx,in_RSI,&local_28,in_RDX);
  return extraout_EAX;
}

Assistant:

void ChannelControl<ch>::init(IApuIo &apu, WaveformTable const& waveTable, ChannelState const& state) noexcept {
    ChannelState fakeLast = state;
    fakeLast.playing = !state.playing;
    fakeLast.envelope = ~state.envelope;
    fakeLast.panning = ~state.panning;
    fakeLast.timbre = ~state.timbre;
    fakeLast.frequency = ~state.frequency;
    update(apu, waveTable, fakeLast, state);
}